

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalException.cpp
# Opt level: O2

void __thiscall
ApprovalTests::ApprovalMissingException::ApprovalMissingException
          (ApprovalMissingException *this,string *param_1,string *approved)

{
  string sStack_38;
  
  *(undefined ***)&this->super_ApprovalException = &PTR__ApprovalException_001bc520;
  format(&sStack_38,(ApprovalMissingException *)param_1,approved);
  ApprovalException::ApprovalException(&this->super_ApprovalException,&sStack_38);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  *(undefined ***)&this->super_ApprovalException = &PTR__ApprovalException_001bc520;
  return;
}

Assistant:

ApprovalMissingException::ApprovalMissingException(const std::string&,
                                                       const std::string& approved)
        : ApprovalException(format(approved))
    {
    }